

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  pointer peVar5;
  int r;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  int c;
  long lVar9;
  int in_R8D;
  extrema *e_1;
  pointer peVar10;
  int i;
  pointer peVar11;
  ulong uVar12;
  allocator local_309;
  Matx<double,_4,_1> local_308;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> matchKP1;
  uint cnt_match;
  uint n_pixels2;
  uint n_pixels1;
  vector<extrema,_std::allocator<extrema>_> ex2;
  vector<extrema,_std::allocator<extrema>_> ex1;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  Mat matches;
  Point_<int> local_1e8;
  _InputArray local_1e0;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> matchKP2;
  Mat colorfulImage;
  Mat colorfulImage2;
  Mat image2;
  Mat image;
  
  ex1.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ex1.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ex1.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cv::Mat::Mat(&image);
  cv::Mat::Mat(&colorfulImage);
  std::__cxx11::string::string
            ((string *)&image2,"/Users/hsjimwang/Desktop/SIFT/cookbeef1.jpg",
             (allocator *)&colorfulImage2);
  cv::imread((string *)&matches,(int)&image2);
  cv::Mat::operator=(&colorfulImage,&matches);
  cv::Mat::~Mat(&matches);
  std::__cxx11::string::~string((string *)&image2);
  matches.data = (uchar *)0x0;
  image2.data = (uchar *)0x0;
  matches.flags = 0x1010000;
  image2.flags = 0x2010000;
  matches._8_8_ = &colorfulImage;
  image2._8_8_ = &image;
  cv::cvtColor((cv *)&matches,(_InputArray *)&image2,(_OutputArray *)0x6,0,in_R8D);
  rescale(&colorfulImage,&image);
  SIFTDescript((vector<extrema,_std::allocator<extrema>_> *)&matches,&image,&n_pixels1);
  std::vector<extrema,_std::allocator<extrema>_>::_M_move_assign(&ex1,&matches);
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)&matches);
  poVar6 = std::operator<<((ostream *)&std::cout,"From ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6," point, ");
  poVar6 = std::operator<<((ostream *)&std::cout,"we extracted ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," interest points.");
  std::endl<char,std::char_traits<char>>(poVar6);
  cv::Mat::Mat(&image2);
  cv::Mat::Mat(&colorfulImage2);
  std::__cxx11::string::string
            ((string *)&local_308,"/Users/hsjimwang/Desktop/SIFT/cookbeef2.jpg",
             (allocator *)&matchKP1);
  cv::imread((string *)&matches,(int)&local_308);
  cv::Mat::operator=(&colorfulImage2,&matches);
  cv::Mat::~Mat(&matches);
  std::__cxx11::string::~string((string *)&local_308);
  matches.data = (uchar *)0x0;
  local_308.val[2] = 0.0;
  matches.flags = 0x1010000;
  local_308.val[0] = (double)CONCAT44(local_308.val[0]._4_4_,0x2010000);
  local_308.val[1] = (double)&image2;
  matches._8_8_ = &colorfulImage2;
  cv::cvtColor((cv *)&matches,(_InputArray *)&local_308,(_OutputArray *)0x6,0,in_R8D);
  rescale(&colorfulImage2,&image2);
  SIFTDescript((vector<extrema,_std::allocator<extrema>_> *)&matches,&image2,&n_pixels2);
  std::vector<extrema,_std::allocator<extrema>_>::_M_move_assign(&ex2,&matches);
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)&matches);
  poVar6 = std::operator<<((ostream *)&std::cout,"From ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6," point, ");
  poVar6 = std::operator<<((ostream *)&std::cout,"we extracted ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," interest points.");
  std::endl<char,std::char_traits<char>>(poVar6);
  peVar10 = ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (peVar11 = ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
                 super__Vector_impl_data._M_start;
      peVar5 = ex1.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
               super__Vector_impl_data._M_finish, peVar11 != peVar10; peVar11 = peVar11 + 1) {
    extrema::extrema((extrema *)&matches,peVar11);
    matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_270 = (int)ROUND((float)matches.cols);
    local_26c = (int)ROUND(matches.data._0_4_);
    matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(matchKP1.
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3010000);
    matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&colorfulImage2;
    cv::Matx<double,_4,_1>::Matx(&local_308);
    local_308.val[0] = 0.0;
    local_308.val[1] = 255.0;
    local_308.val[2] = 255.0;
    local_308.val[3] = 0.0;
    cv::circle(&matchKP1,&local_270,3,&local_308,1,8,0);
    extrema::~extrema((extrema *)&matches);
  }
  for (peVar10 = ex1.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
                 super__Vector_impl_data._M_start; peVar10 != peVar5; peVar10 = peVar10 + 1) {
    local_308.val[2] = 0.0;
    local_308.val[0] = (double)CONCAT44(local_308.val[0]._4_4_,0x3010000);
    local_308.val[1] = (double)&colorfulImage;
    local_278 = (int)ROUND((peVar10->pt).x);
    local_274 = (int)ROUND((peVar10->pt).y);
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&matches);
    matches.flags = 0;
    matches.dims = 0;
    matches.rows = 0;
    matches.cols = 0x406fe000;
    matches.data = (uchar *)0x406fe00000000000;
    matches.datastart = (uchar *)0x0;
    cv::circle(&local_308,&local_278,3,&matches,1,8,0);
  }
  std::__cxx11::string::string((string *)&matches,"show",(allocator *)&matchKP1);
  local_308.val[2] = 0.0;
  local_308.val[0]._0_4_ = 0x1010000;
  local_308.val[1] = (double)&colorfulImage;
  cv::imshow((string *)&matches,(_InputArray *)&local_308);
  std::__cxx11::string::~string((string *)&matches);
  cv::waitKey(0);
  std::__cxx11::string::string((string *)&matches,"show",(allocator *)&matchKP1);
  local_308.val[2] = 0.0;
  local_308.val[0] = (double)CONCAT44(local_308.val[0]._4_4_,0x1010000);
  local_308.val[1] = (double)&colorfulImage2;
  cv::imshow((string *)&matches,(_InputArray *)&local_308);
  std::__cxx11::string::~string((string *)&matches);
  cv::waitKey(0);
  matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matchKP2.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matchKP2.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  matchKP2.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cnt_match = 0;
  findMatches(&ex1,&ex2,&matchKP1,&matchKP2,&cnt_match);
  poVar6 = std::operator<<((ostream *)&std::cout,"We matched ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," pairs.");
  std::endl<char,std::char_traits<char>>(poVar6);
  iVar3 = colorfulImage2.rows;
  if (colorfulImage2.rows < colorfulImage.rows) {
    iVar3 = colorfulImage.rows;
  }
  cv::Mat::Mat(&matches,iVar3,colorfulImage2.cols + colorfulImage.cols,0x10);
  for (lVar7 = 0; lVar7 < colorfulImage.rows; lVar7 = lVar7 + 1) {
    lVar8 = 0;
    for (lVar9 = 0; lVar9 < colorfulImage.cols; lVar9 = lVar9 + 1) {
      sVar1 = *colorfulImage.step.p;
      sVar2 = *matches.step.p;
      matches.data[lVar8 + 2 + sVar2 * lVar7] = colorfulImage.data[lVar8 + 2 + sVar1 * lVar7];
      *(undefined2 *)(matches.data + lVar8 + sVar2 * lVar7) =
           *(undefined2 *)(colorfulImage.data + lVar8 + sVar1 * lVar7);
      lVar8 = lVar8 + 3;
    }
  }
  for (lVar7 = 0; lVar7 < colorfulImage2.rows; lVar7 = lVar7 + 1) {
    lVar8 = 0;
    for (lVar9 = 0; lVar9 < colorfulImage2.cols; lVar9 = lVar9 + 1) {
      sVar1 = *colorfulImage2.step.p;
      sVar2 = *matches.step.p;
      lVar4 = (colorfulImage.cols + lVar9) * 3;
      matches.data[lVar4 + sVar2 * lVar7 + 2] = colorfulImage2.data[lVar8 + 2 + sVar1 * lVar7];
      *(undefined2 *)(matches.data + lVar4 + sVar2 * lVar7) =
           *(undefined2 *)(colorfulImage2.data + lVar8 + sVar1 * lVar7);
      lVar8 = lVar8 + 3;
    }
  }
  for (uVar12 = 0;
      uVar12 < (ulong)((long)matchKP1.
                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)matchKP1.
                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1) {
    local_1e0.sz.width = 0;
    local_1e0.sz.height = 0;
    local_1e0.flags = 0x3010000;
    local_1e0.obj = &matches;
    local_1e8 = matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar12];
    local_280 = colorfulImage.cols +
                matchKP2.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar12].x;
    local_27c = matchKP2.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar12].y;
    cv::Matx<double,_4,_1>::Matx(&local_308);
    local_308.val[0] = 200.0;
    local_308.val[1] = 200.0;
    local_308.val[2] = 0.0;
    local_308.val[3] = 0.0;
    cv::line(&local_1e0,&local_1e8,&local_280,&local_308,1,8,0);
  }
  std::__cxx11::string::string((string *)&local_308,"ShowMatches",&local_309);
  local_1e0.sz.width = 0;
  local_1e0.sz.height = 0;
  local_1e0.flags = 0x1010000;
  local_1e0.obj = &matches;
  cv::imshow((string *)&local_308,&local_1e0);
  std::__cxx11::string::~string((string *)&local_308);
  cv::waitKey(0);
  cv::Mat::~Mat(&matches);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&matchKP2.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  cv::Mat::~Mat(&colorfulImage2);
  cv::Mat::~Mat(&image2);
  cv::Mat::~Mat(&colorfulImage);
  cv::Mat::~Mat(&image);
  std::vector<extrema,_std::allocator<extrema>_>::~vector(&ex2);
  std::vector<extrema,_std::allocator<extrema>_>::~vector(&ex1);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
    vector<extrema> ex1, ex2;
    Mat image, colorfulImage;
    unsigned n_pixels1, n_pixels2;
    colorfulImage = imread("/Users/hsjimwang/Desktop/SIFT/cookbeef1.jpg");
    cvtColor(colorfulImage, image, COLOR_BGR2GRAY);
    rescale(colorfulImage, image);
    ex1 = SIFTDescript(image, n_pixels1);
    cout << "From " << n_pixels1 << " point, ";
    cout << "we extracted " << ex1.size() << " interest points." << endl;

    Mat image2, colorfulImage2;
    colorfulImage2 = imread("/Users/hsjimwang/Desktop/SIFT/cookbeef2.jpg");
    cvtColor(colorfulImage2, image2, COLOR_BGR2GRAY);
    rescale(colorfulImage2, image2);
    ex2 = SIFTDescript(image2, n_pixels2);
    cout << "From " << n_pixels2 << " point, ";
    cout << "we extracted " << ex2.size() << " interest points." << endl;
    for(auto e:ex2){
        circle(colorfulImage2, e.pt, 3, Scalar(0,255,255));
    }

    for(const auto& e:ex1){
        circle(colorfulImage, e.pt, 3, Scalar(0,255,255));
    }

    imshow("show", colorfulImage);
    waitKey(0);
    imshow("show", colorfulImage2);
    waitKey(0);

    vector<Point> matchKP1, matchKP2;
    unsigned cnt_match = 0;
    findMatches(ex1, ex2, matchKP1, matchKP2, cnt_match);
    cout << "We matched " << cnt_match << " pairs." << endl;

    // Show the matches
    int height = colorfulImage.rows;
    if(colorfulImage.rows < colorfulImage2.rows) height = colorfulImage2.rows;
     Mat matches(height, colorfulImage.cols + colorfulImage2.cols, CV_8UC3);
    for(int r = 0; r < colorfulImage.rows; r++){
        for(int c = 0; c < colorfulImage.cols; c++)
            matches.at<Vec3b>(r,c) = colorfulImage.at<Vec3b>(r,c);
    }
    for(int r = 0; r < colorfulImage2.rows; r++){
        for(int c = 0; c < colorfulImage2.cols; c++)
            matches.at<Vec3b>(r,c+colorfulImage.cols) = colorfulImage2.at<Vec3b>(r,c);
    }
    for(int i=0; i<matchKP1.size(); i++){
        line(matches,matchKP1[i],Point(matchKP2[i].x+colorfulImage.cols, matchKP2[i].y),Scalar(200,200,0));
    }
    imshow("ShowMatches", matches);
    waitKey(0);
    return 0;
}